

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_alloc.c
# Opt level: O2

int simple_compare_function(void *l,void *r)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (r <= l) {
    uVar1 = (uint)(r < l);
  }
  return uVar1;
}

Assistant:

static int
simple_compare_function(const void *l, const void *r)
{
    DW_TSHASHTYPE lp = (DW_TSHASHTYPE)(uintptr_t)l;
    DW_TSHASHTYPE rp = (DW_TSHASHTYPE)(uintptr_t)r;
    if (lp < rp) {
        return -1;
    }
    if (lp > rp) {
        return 1;
    }
    return 0;
}